

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asset-resolution.cc
# Opt level: O1

bool __thiscall
tinyusdz::AssetResolutionResolver::find(AssetResolutionResolver *this,string *assetPath)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
  *this_00;
  void *pvVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  bool bVar7;
  string fpath;
  string err;
  string ext;
  uint64_t sz;
  string local_a8;
  string local_88;
  string local_68;
  uint64_t local_48 [3];
  
  io::GetFileExtension(&local_68,assetPath);
  this_00 = &this->_asset_resolution_handlers;
  cVar5 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
          ::find(&this_00->_M_t,&local_68);
  if ((((_Rb_tree_header *)cVar5._M_node ==
        &(this->_asset_resolution_handlers)._M_t._M_impl.super__Rb_tree_header) ||
      (pmVar6 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                ::at(this_00,&local_68), pmVar6->resolve_fun == (FSResolveAsset)0x0)) ||
     (pmVar6 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::at(this_00,&local_68), pmVar6->size_fun == (FSSizeAsset)0x0)) {
    iVar4 = ::std::__cxx11::string::compare((char *)&this->_current_working_path);
    if ((iVar4 == 0) ||
       (iVar4 = ::std::__cxx11::string::compare((char *)&this->_current_working_path), iVar4 == 0))
    {
      local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_string_length = 0;
      local_88.field_2._M_allocated_capacity = 0;
      io::FindFile(&local_a8,assetPath,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      pcVar2 = (this->_current_working_path)._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,pcVar2 + (this->_current_working_path)._M_string_length)
      ;
      local_48[0] = 0;
      local_48[1] = 0;
      local_48[2] = 0;
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_48,
                 &local_88,&local_68);
      io::FindFile(&local_a8,assetPath,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      sVar3 = local_a8._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
      bVar7 = true;
      if (sVar3 != 0) goto LAB_003c6f2e;
    }
    io::FindFile(&local_a8,assetPath,&this->_search_paths);
    bVar7 = local_a8._M_string_length != 0;
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    bVar7 = false;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity =
         local_88.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pmVar6 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
             ::at(this_00,&local_68);
    pvVar1 = pmVar6->userdata;
    pmVar6 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
             ::at(this_00,&local_68);
    iVar4 = (*pmVar6->resolve_fun)
                      ((assetPath->_M_dataplus)._M_p,&this->_search_paths,&local_a8,&local_88,pvVar1
                      );
    if (iVar4 == 0) {
      local_48[0] = 0;
      pmVar6 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::at(this_00,&local_68);
      iVar4 = (*pmVar6->size_fun)(local_a8._M_dataplus._M_p,local_48,&local_88,pvVar1);
      bVar7 = local_48[0] != 0 && iVar4 == 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
LAB_003c6f2e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool AssetResolutionResolver::find(const std::string &assetPath) const {
  DCOUT("search_paths = " << _search_paths);
  DCOUT("assetPath = " << assetPath);

  std::string ext = io::GetFileExtension(assetPath);

  if (_asset_resolution_handlers.count(ext)) {
    if (_asset_resolution_handlers.at(ext).resolve_fun && _asset_resolution_handlers.at(ext).size_fun) {
      std::string resolvedPath;
      std::string err;

      // Use custom handler's userdata
      void *userdata = _asset_resolution_handlers.at(ext).userdata;

      int ret = _asset_resolution_handlers.at(ext).resolve_fun(assetPath.c_str(), _search_paths, &resolvedPath, &err, userdata);
      if (ret != 0) {
        return false;
      }

      uint64_t sz{0};
      ret = _asset_resolution_handlers.at(ext).size_fun(resolvedPath.c_str(), &sz, &err, userdata);
      if (ret != 0) {
        return false;
      }

      return sz > 0;

    } else {
      DCOUT("Either Resolve function or Size function is nullptr. Fallback to built-in file handler.");
    }
  }

  if ((_current_working_path == ".") || (_current_working_path == "./")) {
    std::string rpath = io::FindFile(assetPath, {});
  } else {
    // TODO: Only find when input path is relative.
    std::string rpath = io::FindFile(assetPath, {_current_working_path});
    if (rpath.size()) {
      return true;
    }
  }

  // TODO: Cache resolition.
  std::string fpath = io::FindFile(assetPath, _search_paths);
  return fpath.size();

}